

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  string local_70;
  string local_50;
  allocator local_29;
  
  LazyStat<Catch::TestRunInfo>::operator=
            (&(this->super_StreamingReporterBase).currentTestRunInfo,testInfo);
  (this->m_xml).m_os = (this->super_StreamingReporterBase).stream;
  std::__cxx11::string::string((string *)&local_50,"Catch",(allocator *)&local_70);
  XmlWriter::startElement(&this->m_xml,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
    _vptr_NonCopyable[6])(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (local_50._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_50,"name",&local_29);
    (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[6])(&local_70);
    XmlWriter::writeAttribute(&this->m_xml,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testRunStarting( testInfo );
            m_xml.setStream( stream );
            m_xml.startElement( "Catch" );
            if( !m_config->name().empty() )
                m_xml.writeAttribute( "name", m_config->name() );
        }